

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_regions.cpp
# Opt level: O1

void __thiscall
Am_Region_Impl::Intersect
          (Am_Region_Impl *this,int the_left,int the_top,uint the_width,uint the_height)

{
  iterator *piVar1;
  _Elt_pointer pp_Var2;
  undefined8 uVar3;
  _Elt_pointer pp_Var4;
  _Elt_pointer pp_Var5;
  XRectangle x_rect;
  undefined8 local_20;
  
  if ((this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur ==
      (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    local_20 = (_XRegion *)XCreateRegion();
    pp_Var4 = (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (pp_Var4 ==
        (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<_XRegion*,std::allocator<_XRegion*>>::_M_push_back_aux<_XRegion*>
                ((deque<_XRegion*,std::allocator<_XRegion*>> *)&this->stack,(_XRegion **)&local_20);
    }
    else {
      *pp_Var4 = local_20;
      piVar1 = &(this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
                super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
  }
  else {
    local_20 = (_XRegion *)
               CONCAT26((short)the_height,
                        CONCAT24((short)the_width,CONCAT22((short)the_top,(short)the_left)));
    uVar3 = XCreateRegion();
    XUnionRectWithRegion(&local_20,uVar3,uVar3);
    pp_Var4 = (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    pp_Var2 = (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first;
    pp_Var5 = pp_Var4;
    if (pp_Var4 == pp_Var2) {
      pp_Var5 = (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    if (pp_Var4 == pp_Var2) {
      pp_Var4 = (this->stack).c.super__Deque_base<_XRegion_*,_std::allocator<_XRegion_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    XIntersectRegion(uVar3,pp_Var5[-1],pp_Var4[-1]);
    XDestroyRegion(uVar3);
  }
  return;
}

Assistant:

void
Am_Region_Impl::Intersect(int the_left, int the_top, unsigned int the_width,
                          unsigned int the_height)
{
  if (stack.empty()) {
    // Create a new region for top if needed
    stack.push(XCreateRegion());
  } else {
    // Set up a rectangle
    XRectangle x_rect; // was static ???
    x_rect.x = the_left;
    x_rect.y = the_top;
    x_rect.width = the_width;
    x_rect.height = the_height;
    Region rect_region = XCreateRegion();
    XUnionRectWithRegion(&x_rect, rect_region, rect_region);
    // Does the intersection
    XIntersectRegion(rect_region, stack.top(), stack.top());
    XDestroyRegion(rect_region);
  }
}